

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

void __thiscall libebml::EbmlMaster::~EbmlMaster(EbmlMaster *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  ulong local_18;
  size_t Index;
  EbmlMaster *this_local;
  
  (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlMaster_00236760;
  bVar1 = EbmlElement::IsLocked(&this->super_EbmlElement);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    for (local_18 = 0;
        sVar2 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                          (&this->ElementList), local_18 < sVar2; local_18 = local_18 + 1) {
      ppEVar3 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                operator[](&this->ElementList,local_18);
      bVar1 = EbmlElement::IsLocked(*ppEVar3);
      if (!bVar1) {
        ppEVar3 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,local_18);
        if (*ppEVar3 != (value_type)0x0) {
          (*(*ppEVar3)->_vptr_EbmlElement[1])();
        }
      }
    }
    EbmlCrc32::~EbmlCrc32(&this->Checksum);
    std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::~vector
              (&this->ElementList);
    EbmlElement::~EbmlElement(&this->super_EbmlElement);
    return;
  }
  __assert_fail("!IsLocked()",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                ,0x4b,"virtual libebml::EbmlMaster::~EbmlMaster()");
}

Assistant:

EbmlMaster::~EbmlMaster()
{
  assert(!IsLocked()); // you're trying to delete a locked element !!!

  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (!(*ElementList[Index]).IsLocked())  {
      delete ElementList[Index];
    }
  }
}